

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# celt_lpc.c
# Opt level: O0

void celt_iir(opus_val32 *_x,opus_val16 *den,opus_val32 *_y,int N,int ord,opus_val16 *mem)

{
  opus_val16 *x;
  long lVar1;
  opus_val16 *y;
  float fVar2;
  undefined8 uStack_90;
  opus_val16 aoStack_88 [2];
  opus_val16 *local_80;
  long local_78;
  float local_6c;
  opus_val32 local_68;
  opus_val32 sum_1;
  opus_val32 sum [4];
  unsigned_long __vla_expr1;
  unsigned_long __vla_expr0;
  int local_38;
  int local_34;
  int j;
  int i;
  opus_val16 *mem_local;
  int ord_local;
  int N_local;
  opus_val32 *_y_local;
  opus_val16 *den_local;
  opus_val32 *_x_local;
  
  local_80 = (opus_val16 *)((long)aoStack_88 - ((ulong)(uint)ord * 4 + 0xf & 0xfffffffffffffff0));
  lVar1 = (long)local_80 - ((ulong)(uint)(N + ord) * 4 + 0xf & 0xfffffffffffffff0);
  for (local_34 = 0; local_34 < ord; local_34 = local_34 + 1) {
    local_80[local_34] = den[(ord - local_34) + -1];
  }
  for (local_34 = 0; local_34 < ord; local_34 = local_34 + 1) {
    *(float *)(lVar1 + (long)local_34 * 4) = -mem[(ord - local_34) + -1];
  }
  for (; local_34 < N + ord; local_34 = local_34 + 1) {
    *(undefined4 *)(lVar1 + (long)local_34 * 4) = 0;
  }
  local_78 = lVar1;
  for (local_34 = 0; x = local_80, local_34 < N + -3; local_34 = local_34 + 4) {
    local_68 = _x[local_34];
    sum_1 = _x[local_34 + 1];
    sum[0] = _x[local_34 + 2];
    sum[1] = _x[local_34 + 3];
    y = (opus_val16 *)(local_78 + (long)local_34 * 4);
    *(undefined8 *)(lVar1 + -8) = 0x101fec;
    xcorr_kernel(x,y,&local_68,ord);
    *(float *)(local_78 + (long)(local_34 + ord) * 4) = -(float)local_68;
    _y[local_34] = local_68;
    fVar2 = *(float *)(local_78 + (long)(local_34 + ord) * 4) * *den + (float)sum_1;
    *(float *)(local_78 + (long)(local_34 + ord + 1) * 4) = -fVar2;
    _y[local_34 + 1] = (opus_val32)fVar2;
    fVar2 = *(float *)(local_78 + (long)(local_34 + ord) * 4) * den[1] +
            *(float *)(local_78 + (long)(local_34 + ord + 1) * 4) * *den + (float)sum[0];
    *(float *)(local_78 + (long)(local_34 + ord + 2) * 4) = -fVar2;
    _y[local_34 + 2] = (opus_val32)fVar2;
    fVar2 = *(float *)(local_78 + (long)(local_34 + ord) * 4) * den[2] +
            *(float *)(local_78 + (long)(local_34 + ord + 1) * 4) * den[1] +
            *(float *)(local_78 + (long)(local_34 + ord + 2) * 4) * *den + (float)sum[1];
    *(float *)(local_78 + (long)(local_34 + ord + 3) * 4) = -fVar2;
    _y[local_34 + 3] = (opus_val32)fVar2;
  }
  for (; local_34 < N; local_34 = local_34 + 1) {
    local_6c = (float)_x[local_34];
    for (local_38 = 0; local_38 < ord; local_38 = local_38 + 1) {
      local_6c = -local_80[local_38] * *(float *)(local_78 + (long)(local_34 + local_38) * 4) +
                 local_6c;
    }
    *(float *)(local_78 + (long)(local_34 + ord) * 4) = local_6c;
    _y[local_34] = (opus_val32)local_6c;
  }
  for (local_34 = 0; local_34 < ord; local_34 = local_34 + 1) {
    mem[local_34] = (opus_val16)_y[(N - local_34) + -1];
  }
  return;
}

Assistant:

void celt_iir(const opus_val32 *_x,
              const opus_val16 *den,
              opus_val32 *_y,
              int N,
              int ord,
              opus_val16 *mem) {
#ifdef SMALL_FOOTPRINT
    int i,j;
    for (i=0;i<N;i++)
    {
       opus_val32 sum = _x[i];
       for (j=0;j<ord;j++)
       {
          sum -= MULT16_16(den[j],mem[j]);
       }
       for (j=ord-1;j>=1;j--)
       {
          mem[j]=mem[j-1];
       }
       mem[0] = SROUND16(sum, SIG_SHIFT);
       _y[i] = sum;
    }
#else
    int i, j;
    celt_assert((ord & 3) == 0);
    opus_val16 rden[ord];
    opus_val16 y[N + ord];
    for (i = 0; i < ord; i++)
        rden[i] = den[ord - i - 1];
    for (i = 0; i < ord; i++)
        y[i] = -mem[ord - i - 1];
    for (; i < N + ord; i++)
        y[i] = 0;
    for (i = 0; i < N - 3; i += 4) {
        /* Unroll by 4 as if it were an FIR filter */
        opus_val32 sum[4];
        sum[0] = _x[i];
        sum[1] = _x[i + 1];
        sum[2] = _x[i + 2];
        sum[3] = _x[i + 3];
        xcorr_kernel(rden, y + i, sum, ord);

        /* Patch up the result to compensate for the fact that this is an IIR */
        y[i + ord] = -SROUND16(sum[0], SIG_SHIFT);
        _y[i] = sum[0];
        sum[1] = MAC16_16(sum[1], y[i + ord], den[0]);
        y[i + ord + 1] = -SROUND16(sum[1], SIG_SHIFT);
        _y[i + 1] = sum[1];
        sum[2] = MAC16_16(sum[2], y[i + ord + 1], den[0]);
        sum[2] = MAC16_16(sum[2], y[i + ord], den[1]);
        y[i + ord + 2] = -SROUND16(sum[2], SIG_SHIFT);
        _y[i + 2] = sum[2];

        sum[3] = MAC16_16(sum[3], y[i + ord + 2], den[0]);
        sum[3] = MAC16_16(sum[3], y[i + ord + 1], den[1]);
        sum[3] = MAC16_16(sum[3], y[i + ord], den[2]);
        y[i + ord + 3] = -SROUND16(sum[3], SIG_SHIFT);
        _y[i + 3] = sum[3];
    }
    for (; i < N; i++) {
        opus_val32 sum = _x[i];
        for (j = 0; j < ord; j++)
            sum -= MULT16_16(rden[j], y[i + j]);
        y[i + ord] = SROUND16(sum, SIG_SHIFT);
        _y[i] = sum;
    }
    for (i = 0; i < ord; i++)
        mem[i] = _y[N - i - 1];
#endif
}